

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_1bdfec::LogisimParser::~LogisimParser(LogisimParser *this)

{
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
  *p_Var1;
  __node_ptr in_RSI;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
  *this_00;
  
  CircuitConstruction::~CircuitConstruction(&this->m_context);
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
             *)(this->m_circuits)._M_h._M_before_begin._M_nxt;
  while (this_00 !=
         (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
          *)0x0) {
    p_Var1 = *(_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
               **)this_00;
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_true>_>_>
    ::_M_deallocate_node(this_00,in_RSI);
    this_00 = p_Var1;
  }
  memset((this->m_circuits)._M_h._M_buckets,0,(this->m_circuits)._M_h._M_bucket_count << 3);
  (this->m_circuits)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_circuits)._M_h._M_element_count = 0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::LogisimParser::CircuitConstruction>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_deallocate_buckets(&(this->m_circuits)._M_h);
  return;
}

Assistant:

LogisimParser(pugi::xml_document *xml_doc, LSimContext *lsim_context) : 
            m_xml_doc(xml_doc), 
            m_lsim_context(lsim_context) {
    }